

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitArrayLen
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          ArrayLen *curr)

{
  shared_ptr<wasm::GCData> sVar1;
  undefined1 local_90 [8];
  Flow ref;
  undefined1 local_30 [8];
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_90,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    Flow::getSingleValue((Flow *)local_90);
    sVar1 = Literal::getGCData((Literal *)local_30);
    if (local_30 == (undefined1  [8])0x0) {
      (*this->_vptr_ExpressionRunner[2])
                (this,"null ref",
                 sVar1.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
    }
    ref.breakTo.super_IString.str._M_str._0_4_ =
         (int)(((long)(((element_type *)local_30)->values).super_SmallVector<wasm::Literal,_1UL>.
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(((element_type *)local_30)->values).super_SmallVector<wasm::Literal,_1UL>.
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18) +
         (int)(((element_type *)local_30)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    Flow::Flow(__return_storage_ptr__,(Literal *)&ref.breakTo.super_IString.str._M_str);
    Literal::~Literal((Literal *)&ref.breakTo.super_IString.str._M_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_90);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayLen(ArrayLen* curr) {
    NOTE_ENTER("ArrayLen");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    return Literal(int32_t(data->values.size()));
  }